

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CMU462::HalfedgeMesh::build
          (HalfedgeMesh *this,
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          *polygons,vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *vertexPositions)

{
  ulong uVar1;
  HalfedgeIter HVar2;
  bool bVar3;
  size_type sVar4;
  reference puVar5;
  size_type sVar6;
  pointer this_00;
  reference pvVar7;
  const_reference pvVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  pointer ppVar11;
  iterator iVar12;
  VertexIter *pVVar13;
  VertexIter *pVVar14;
  pointer pEVar15;
  EdgeIter *pEVar16;
  reference pvVar17;
  reference pvVar18;
  HalfedgeIter *pHVar19;
  HalfedgeIter *pHVar20;
  pointer pHVar21;
  FaceIter *pFVar22;
  pointer pFVar23;
  mapped_type *pmVar24;
  size_type sVar25;
  ostream *poVar26;
  pointer ppVar27;
  const_reference pvVar28;
  pointer pVVar29;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar30;
  bool local_5b9;
  _List_iterator<CMU462::Vertex> local_390;
  VertexIter v_4;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
  local_380;
  iterator local_378;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
  local_370;
  const_iterator e_2;
  int i;
  _List_iterator<CMU462::Halfedge> local_358;
  HalfedgeIter h_2;
  Size count;
  _Self local_340;
  _Self local_338;
  iterator v_3;
  _Self local_328;
  _Self local_320;
  VertexIter v_2;
  Index q;
  Index p_1;
  Size degree_2;
  _List_iterator<CMU462::Edge> local_2f0;
  EdgeIter e_1;
  HalfedgeIter t;
  HalfedgeIter i_5;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  boundaryHalfedges;
  FaceIter b_1;
  _Self local_2b0;
  _Self local_2a8;
  HalfedgeIter h_1;
  _Self local_298;
  _List_iterator<CMU462::Halfedge> local_290;
  HalfedgeIter h;
  _Self local_280;
  VertexIter v_1;
  Index j;
  Index i_4;
  _List_iterator<CMU462::Edge> local_250;
  EdgeIter e;
  _List_iterator<CMU462::Halfedge> hba;
  _Self local_238;
  iterator iba;
  IndexPair ba;
  _Self local_218;
  _Self local_210;
  _List_iterator<CMU462::Halfedge> local_208;
  HalfedgeIter hab;
  IndexPair ab;
  Index b;
  Index a;
  Index i_3;
  Size degree_1;
  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
  faceHalfedges;
  _List_iterator<CMU462::Face> local_1a0;
  FaceIter f;
  PolygonListCIter p;
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  pairToHalfedge;
  Size nFaces;
  unsigned_long i_2;
  const_iterator __end3;
  const_iterator __begin3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range3;
  Size degree;
  _List_iterator<CMU462::Vertex> local_128;
  VertexIter v;
  _Self local_118;
  _Base_ptr local_110;
  undefined1 local_108;
  unsigned_long local_100;
  unsigned_long i_1;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> polygonIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *polygon;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *__range1;
  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  vertexDegree;
  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  indexToVertex;
  vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_> *vertexPositions_local;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *polygons_local;
  HalfedgeMesh *this_local;
  
  std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::clear(&this->halfedges);
  std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::clear(&this->vertices);
  std::__cxx11::list<CMU462::Edge,_std::allocator<CMU462::Edge>_>::clear(&this->edges);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear(&this->faces);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::clear(&this->boundaries);
  std::
  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
  ::map((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
         *)&vertexDegree._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
  ::map((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
         *)&__range1);
  __end1 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::begin(polygons);
  polygon = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
            std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::end(polygons);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                                     *)&polygon), bVar3) {
    pvVar7 = __gnu_cxx::
             __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
             ::operator*(&__end1);
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar7);
    if (sVar6 < 3) {
      poVar26 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: each polygon must have at least three vertices."
                               );
      std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &__range2);
    __end2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar7);
    i_1 = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar7);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       *)&i_1), bVar3) {
      puVar5 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&__end2);
      local_100 = *puVar5;
      pVar30 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)&__range2,&local_100);
      local_110 = (_Base_ptr)pVar30.first._M_node;
      local_108 = pVar30.second;
      local_118._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
           ::find((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                   *)&vertexDegree._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_100);
      v._M_node = (_List_node_base *)
                  std::
                  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                  ::end((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                         *)&vertexDegree._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar3 = std::operator==(&local_118,(_Self *)&v);
      if (bVar3) {
        local_128._M_node = (_List_node_base *)newVertex(this);
        iVar12 = std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                           (&this->halfedges);
        pVVar29 = std::_List_iterator<CMU462::Vertex>::operator->(&local_128);
        pHVar20 = Vertex::halfedge(pVVar29);
        pHVar20->_M_node = iVar12._M_node;
        pmVar10 = std::
                  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                  ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                *)&vertexDegree._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               &local_100);
        pmVar10->_M_node = local_128._M_node;
        pmVar24 = std::
                  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                  ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                *)&__range1,&local_128);
        *pmVar24 = 1;
      }
      else {
        pmVar10 = std::
                  map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                  ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                *)&vertexDegree._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               &local_100);
        pmVar24 = std::
                  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                  ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                *)&__range1,pmVar10);
        *pmVar24 = *pmVar24 + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&__end2);
    }
    sVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(pvVar7);
    sVar4 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::size
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&__range2);
    if (sVar4 < sVar6) {
      poVar26 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: one of the input polygons does not have distinct vertices!"
                               );
      std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
      std::operator<<((ostream *)&std::cerr,"(vertex indices:");
      __end3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(pvVar7);
      i_2 = (unsigned_long)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(pvVar7);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                         *)&i_2), bVar3) {
        puVar5 = __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator*(&__end3);
        uVar1 = *puVar5;
        poVar26 = std::operator<<((ostream *)&std::cerr," ");
        std::ostream::operator<<(poVar26,uVar1);
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&__end3);
      }
      poVar26 = std::operator<<((ostream *)&std::cerr,")");
      std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::~set
              ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
               &__range2);
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::operator++(&__end1);
  }
  sVar6 = std::
          vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ::size(polygons);
  std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::resize(&this->faces,sVar6);
  std::
  map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
  ::map((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
         *)&p);
  __gnu_cxx::
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::__normal_iterator((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                       *)&f);
  std::_List_iterator<CMU462::Face>::_List_iterator(&local_1a0);
  f._M_node = (_List_node_base *)
              std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::begin(polygons);
  local_1a0._M_node =
       (_List_node_base *)
       std::__cxx11::list<CMU462::Face,_std::allocator<CMU462::Face>_>::begin(&this->faces);
  while( true ) {
    faceHalfedges.
    super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::
                  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ::end(polygons);
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                        *)&f,(__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              *)&faceHalfedges.
                                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar3) break;
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
              *)&degree_1);
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ::operator->((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                            *)&f);
    i_3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(this_00);
    for (a = 0; a < i_3; a = a + 1) {
      pvVar7 = __gnu_cxx::
               __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator*((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                            *)&f);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar7,a);
      b = *pvVar8;
      pvVar7 = __gnu_cxx::
               __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator*((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                            *)&f);
      pvVar8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (pvVar7,(a + 1) % i_3);
      ab.second = *pvVar8;
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                ((pair<unsigned_long,_unsigned_long> *)&hab,&b,&ab.second);
      std::_List_iterator<CMU462::Halfedge>::_List_iterator(&local_208);
      local_210._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
           ::find((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                   *)&p,(key_type *)&hab);
      local_218._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
           ::end((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                  *)&p);
      bVar3 = std::operator!=(&local_210,&local_218);
      if (bVar3) {
        poVar26 = std::operator<<((ostream *)&std::cerr,
                                  "Error converting polygons to halfedge mesh: found multiple oriented edges with indices ("
                                 );
        poVar26 = (ostream *)std::ostream::operator<<(poVar26,b);
        poVar26 = std::operator<<(poVar26,", ");
        poVar26 = (ostream *)std::ostream::operator<<(poVar26,ab.second);
        poVar26 = std::operator<<(poVar26,").");
        std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
        poVar26 = std::operator<<((ostream *)&std::cerr,
                                  "This means that either (i) more than two faces contain this edge (hence the surface is nonmanifold), or"
                                 );
        std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
        poVar26 = std::operator<<((ostream *)&std::cerr,
                                  "(ii) there are exactly two faces containing this edge, but they have the same orientation (hence the surface is"
                                 );
        std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
        poVar26 = std::operator<<((ostream *)&std::cerr,"not consistently oriented.");
        std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
        exit(1);
      }
      local_208._M_node = (_List_node_base *)newHalfedge(this);
      pmVar9 = std::
               map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
               ::operator[]((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                             *)&p,(key_type *)&hab);
      pmVar9->_M_node = local_208._M_node;
      pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_208);
      pFVar22 = Halfedge::face(pHVar21);
      pFVar22->_M_node = local_1a0._M_node;
      pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_208);
      pFVar22 = Halfedge::face(pHVar21);
      pFVar23 = std::_List_iterator<CMU462::Face>::operator->(pFVar22);
      pHVar20 = Face::halfedge(pFVar23);
      pHVar20->_M_node = local_208._M_node;
      pmVar10 = std::
                map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                ::operator[]((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                              *)&vertexDegree._M_t._M_impl.super__Rb_tree_header._M_node_count,&b);
      pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_208);
      pVVar13 = Halfedge::vertex(pHVar21);
      pVVar13->_M_node = pmVar10->_M_node;
      pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_208);
      pVVar13 = Halfedge::vertex(pHVar21);
      pVVar29 = std::_List_iterator<CMU462::Vertex>::operator->(pVVar13);
      pHVar20 = Vertex::halfedge(pVVar29);
      pHVar20->_M_node = local_208._M_node;
      std::
      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
      ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                   *)&degree_1,&local_208);
      std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                ((pair<unsigned_long,_unsigned_long> *)&iba,&ab.second,&b);
      local_238._M_node =
           (_Base_ptr)
           std::
           map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
           ::find((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                   *)&p,(key_type *)&iba);
      hba._M_node = (_List_node_base *)
                    std::
                    map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                    ::end((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                           *)&p);
      bVar3 = std::operator!=(&local_238,(_Self *)&hba);
      if (bVar3) {
        ppVar11 = std::
                  _Rb_tree_iterator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>
                  ::operator->(&local_238);
        e._M_node = (ppVar11->second)._M_node;
        pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_208);
        pHVar20 = Halfedge::twin(pHVar21);
        pHVar20->_M_node = e._M_node;
        pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->
                            ((_List_iterator<CMU462::Halfedge> *)&e);
        pHVar20 = Halfedge::twin(pHVar21);
        pHVar20->_M_node = local_208._M_node;
        local_250._M_node = (_List_node_base *)newEdge(this);
        pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_208);
        pEVar16 = Halfedge::edge(pHVar21);
        pEVar16->_M_node = local_250._M_node;
        pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->
                            ((_List_iterator<CMU462::Halfedge> *)&e);
        pEVar16 = Halfedge::edge(pHVar21);
        pEVar16->_M_node = local_250._M_node;
        pEVar15 = std::_List_iterator<CMU462::Edge>::operator->(&local_250);
        pHVar20 = Edge::halfedge(pEVar15);
        pHVar20->_M_node = local_208._M_node;
      }
      else {
        iVar12 = std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                           (&this->halfedges);
        pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_208);
        pHVar20 = Halfedge::twin(pHVar21);
        pHVar20->_M_node = iVar12._M_node;
      }
    }
    for (j = 0; j < i_3; j = j + 1) {
      pvVar17 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)&degree_1,(j + 1) % i_3);
      pvVar18 = std::
                vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                              *)&degree_1,j);
      pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar18);
      pHVar20 = Halfedge::next(pHVar21);
      pHVar20->_M_node = pvVar17->_M_node;
    }
    std::
    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
    ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
               *)&degree_1);
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
    ::operator++((__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                  *)&f,0);
    v_1._M_node = (_List_node_base *)std::_List_iterator<CMU462::Face>::operator++(&local_1a0,0);
  }
  local_280._M_node = (_List_node_base *)verticesBegin(this);
  do {
    h._M_node = (_List_node_base *)verticesEnd(this);
    bVar3 = std::operator!=(&local_280,(_Self *)&h);
    if (!bVar3) {
      local_2a8._M_node = (_List_node_base *)halfedgesBegin(this);
      while( true ) {
        local_2b0._M_node = (_List_node_base *)halfedgesEnd(this);
        bVar3 = std::operator!=(&local_2a8,&local_2b0);
        if (!bVar3) break;
        pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_2a8);
        pHVar20 = Halfedge::twin(pHVar21);
        b_1._M_node = (_List_node_base *)
                      std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                                (&this->halfedges);
        bVar3 = std::operator==(pHVar20,(_Self *)&b_1);
        if (bVar3) {
          boundaryHalfedges.
          super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)newBoundary(this);
          std::
          vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ::vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    *)&i_5);
          t._M_node = local_2a8._M_node;
          do {
            e_1._M_node = (_List_node_base *)newHalfedge(this);
            std::
            vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
            ::push_back((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                         *)&i_5,(value_type *)&e_1);
            pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&t);
            pHVar20 = Halfedge::twin(pHVar21);
            pHVar20->_M_node = e_1._M_node;
            pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)&e_1);
            pHVar20 = Halfedge::twin(pHVar21);
            pHVar20->_M_node = t._M_node;
            pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)&e_1);
            pFVar22 = Halfedge::face(pHVar21);
            pFVar22->_M_node =
                 (_List_node_base *)
                 boundaryHalfedges.
                 super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&t);
            pHVar20 = Halfedge::next(pHVar21);
            pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar20);
            pVVar13 = Halfedge::vertex(pHVar21);
            pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)&e_1);
            pVVar14 = Halfedge::vertex(pHVar21);
            pVVar14->_M_node = pVVar13->_M_node;
            local_2f0._M_node = (_List_node_base *)newEdge(this);
            pEVar15 = std::_List_iterator<CMU462::Edge>::operator->(&local_2f0);
            pHVar20 = Edge::halfedge(pEVar15);
            pHVar20->_M_node = t._M_node;
            pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&t);
            pEVar16 = Halfedge::edge(pHVar21);
            pEVar16->_M_node = local_2f0._M_node;
            pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->
                                ((_List_iterator<CMU462::Halfedge> *)&e_1);
            pEVar16 = Halfedge::edge(pHVar21);
            pEVar16->_M_node = local_2f0._M_node;
            pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&t);
            pHVar20 = Halfedge::next(pHVar21);
            t._M_node = pHVar20->_M_node;
            while( true ) {
              bVar3 = std::operator!=(&t,&local_2a8);
              local_5b9 = false;
              if (bVar3) {
                pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&t);
                pHVar20 = Halfedge::twin(pHVar21);
                degree_2 = (Size)std::__cxx11::
                                 list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                                           (&this->halfedges);
                local_5b9 = std::operator!=(pHVar20,(_Self *)&degree_2);
              }
              if (local_5b9 == false) break;
              pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&t);
              pHVar20 = Halfedge::twin(pHVar21);
              t._M_node = pHVar20->_M_node;
              pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&t);
              pHVar20 = Halfedge::next(pHVar21);
              t._M_node = pHVar20->_M_node;
            }
            bVar3 = std::operator!=(&t,&local_2a8);
          } while (bVar3);
          pvVar17 = std::
                    vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                    ::front((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                             *)&i_5);
          pFVar23 = std::_List_iterator<CMU462::Face>::operator->
                              ((_List_iterator<CMU462::Face> *)
                               &boundaryHalfedges.
                                super__Vector_base<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
          pHVar20 = Face::halfedge(pFVar23);
          pHVar20->_M_node = pvVar17->_M_node;
          sVar6 = std::
                  vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                  ::size((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                          *)&i_5);
          for (q = 0; q < sVar6; q = q + 1) {
            pvVar17 = std::
                      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                    *)&i_5,((q - 1) + sVar6) % sVar6);
            pvVar18 = std::
                      vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                      ::operator[]((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                                    *)&i_5,q);
            pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(pvVar18);
            pHVar20 = Halfedge::next(pHVar21);
            pHVar20->_M_node = pvVar17->_M_node;
          }
          std::
          vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
          ::~vector((vector<std::_List_iterator<CMU462::Halfedge>,_std::allocator<std::_List_iterator<CMU462::Halfedge>_>_>
                     *)&i_5);
        }
        v_2._M_node = (_List_node_base *)
                      std::_List_iterator<CMU462::Halfedge>::operator++(&local_2a8,0);
      }
      local_320._M_node = (_List_node_base *)verticesBegin(this);
      while( true ) {
        local_328._M_node = (_List_node_base *)verticesEnd(this);
        bVar3 = std::operator!=(&local_320,&local_328);
        if (!bVar3) break;
        pVVar29 = std::_List_iterator<CMU462::Vertex>::operator->(&local_320);
        pHVar20 = Vertex::halfedge(pVVar29);
        pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar20);
        pHVar20 = Halfedge::twin(pHVar21);
        pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar20);
        pHVar20 = Halfedge::next(pHVar21);
        pVVar29 = std::_List_iterator<CMU462::Vertex>::operator->(&local_320);
        pHVar19 = Vertex::halfedge(pVVar29);
        pHVar19->_M_node = pHVar20->_M_node;
        v_3._M_node = (_List_node_base *)
                      std::_List_iterator<CMU462::Vertex>::operator++(&local_320,0);
      }
      local_338._M_node =
           (_List_node_base *)
           std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::begin
                     (&this->vertices);
      while( true ) {
        local_340._M_node =
             (_List_node_base *)
             std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::end
                       (&this->vertices);
        bVar3 = std::operator!=(&local_338,&local_340);
        if (!bVar3) {
          sVar6 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::size
                            (vertexPositions);
          sVar25 = std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::size
                             (&this->vertices);
          if (sVar25 <= sVar6) {
            e_2._M_node._4_4_ = 0;
            local_378._M_node =
                 (_Base_ptr)
                 std::
                 map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                 ::begin((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                          *)&vertexDegree._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::
            _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
            ::_Rb_tree_const_iterator(&local_370,&local_378);
            while( true ) {
              v_4._M_node = (_List_node_base *)
                            std::
                            map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                            ::end((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                                   *)&vertexDegree._M_t._M_impl.super__Rb_tree_header._M_node_count)
              ;
              std::
              _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
              ::_Rb_tree_const_iterator(&local_380,(iterator *)&v_4);
              bVar3 = std::operator!=(&local_370,&local_380);
              if (!bVar3) break;
              ppVar27 = std::
                        _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
                        ::operator->(&local_370);
              local_390._M_node = (ppVar27->second)._M_node;
              pvVar28 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::operator[]
                                  (vertexPositions,(long)e_2._M_node._4_4_);
              pVVar29 = std::_List_iterator<CMU462::Vertex>::operator->(&local_390);
              (pVVar29->position).x = pvVar28->x;
              (pVVar29->position).y = pvVar28->y;
              (pVVar29->position).z = pvVar28->z;
              e_2._M_node._4_4_ = e_2._M_node._4_4_ + 1;
              std::
              _Rb_tree_const_iterator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>
              ::operator++(&local_370,0);
            }
            std::
            map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
            ::~map((map<std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_std::_List_iterator<CMU462::Halfedge>_>_>_>
                    *)&p);
            std::
            map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
            ::~map((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                    *)&__range1);
            std::
            map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
            ::~map((map<unsigned_long,_std::_List_iterator<CMU462::Vertex>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<CMU462::Vertex>_>_>_>
                    *)&vertexDegree._M_t._M_impl.super__Rb_tree_header._M_node_count);
            return;
          }
          poVar26 = std::operator<<((ostream *)&std::cerr,
                                    "Error converting polygons to halfedge mesh: number of vertex positions is different from the number of distinct vertices!"
                                   );
          std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
          poVar26 = std::operator<<((ostream *)&std::cerr,"(number of positions in input: ");
          sVar6 = std::vector<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>::size
                            (vertexPositions);
          poVar26 = (ostream *)std::ostream::operator<<(poVar26,sVar6);
          poVar26 = std::operator<<(poVar26,")");
          std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
          poVar26 = std::operator<<((ostream *)&std::cerr,"(  number of vertices in mesh: ");
          sVar6 = std::__cxx11::list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>::size
                            (&this->vertices);
          poVar26 = (ostream *)std::ostream::operator<<(poVar26,sVar6);
          poVar26 = std::operator<<(poVar26,")");
          std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        pVVar29 = std::_List_iterator<CMU462::Vertex>::operator->(&local_338);
        pHVar20 = Vertex::halfedge(pVVar29);
        count = (Size)std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                                (&this->halfedges);
        bVar3 = std::operator==(pHVar20,(_Self *)&count);
        if (bVar3) break;
        h_2._M_node = (_List_node_base *)0x0;
        pVVar29 = std::_List_iterator<CMU462::Vertex>::operator->(&local_338);
        pHVar20 = Vertex::halfedge(pVVar29);
        local_358._M_node = pHVar20->_M_node;
        do {
          pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_358);
          pFVar22 = Halfedge::face(pHVar21);
          pFVar23 = std::_List_iterator<CMU462::Face>::operator->(pFVar22);
          bVar3 = Face::isBoundary(pFVar23);
          if (!bVar3) {
            h_2._M_node = (_List_node_base *)((long)&(h_2._M_node)->_M_next + 1);
          }
          pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_358);
          pHVar20 = Halfedge::twin(pHVar21);
          pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar20);
          pHVar20 = Halfedge::next(pHVar21);
          local_358._M_node = pHVar20->_M_node;
          pVVar29 = std::_List_iterator<CMU462::Vertex>::operator->(&local_338);
          pHVar20 = Vertex::halfedge(pVVar29);
          bVar3 = std::operator!=(&local_358,pHVar20);
          HVar2 = h_2;
        } while (bVar3);
        pmVar24 = std::
                  map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                  ::operator[]((map<std::_List_iterator<CMU462::Vertex>,_unsigned_long,_std::less<std::_List_iterator<CMU462::Vertex>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Vertex>,_unsigned_long>_>_>
                                *)&__range1,&local_338);
        if (HVar2._M_node != (_List_node_base *)*pmVar24) {
          poVar26 = std::operator<<((ostream *)&std::cerr,
                                    "Error converting polygons to halfedge mesh: at least one of the vertices is nonmanifold."
                                   );
          std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
        std::_List_iterator<CMU462::Vertex>::operator++(&local_338,0);
      }
      poVar26 = std::operator<<((ostream *)&std::cerr,
                                "Error converting polygons to halfedge mesh: some vertices are not referenced by any polygon."
                               );
      std::ostream::operator<<(poVar26,std::endl<char,std::char_traits<char>>);
      exit(1);
    }
    pVVar29 = std::_List_iterator<CMU462::Vertex>::operator->(&local_280);
    pHVar20 = Vertex::halfedge(pVVar29);
    local_290._M_node = pHVar20->_M_node;
    do {
      pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_290);
      pHVar20 = Halfedge::twin(pHVar21);
      local_298._M_node =
           (_List_node_base *)
           std::__cxx11::list<CMU462::Halfedge,_std::allocator<CMU462::Halfedge>_>::end
                     (&this->halfedges);
      bVar3 = std::operator==(pHVar20,&local_298);
      if (bVar3) {
        pVVar29 = std::_List_iterator<CMU462::Vertex>::operator->(&local_280);
        pHVar20 = Vertex::halfedge(pVVar29);
        pHVar20->_M_node = local_290._M_node;
        break;
      }
      pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_290);
      pHVar20 = Halfedge::twin(pHVar21);
      pHVar21 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar20);
      pHVar20 = Halfedge::next(pHVar21);
      local_290._M_node = pHVar20->_M_node;
      pVVar29 = std::_List_iterator<CMU462::Vertex>::operator->(&local_280);
      pHVar20 = Vertex::halfedge(pVVar29);
      bVar3 = std::operator!=(&local_290,pHVar20);
    } while (bVar3);
    h_1._M_node = (_List_node_base *)std::_List_iterator<CMU462::Vertex>::operator++(&local_280,0);
  } while( true );
}

Assistant:

void HalfedgeMesh::build(const vector<vector<Index> >& polygons,
                         const vector<Vector3D>& vertexPositions)
// This method initializes the halfedge data structure from a raw list of
// polygons, where each input polygon is specified as a list of vertex indices.
// The input must describe a manifold, oriented surface, where the orientation
// of a polygon is determined by the order of vertices in the list. Polygons
// must have at least three vertices.  Note that there are no special conditions
// on the vertex indices, i.e., they do not have to start at 0 or 1, nor does
// the collection of indices have to be contiguous.  Overall, this initializer
// is designed to be robust but perhaps not incredibly fast (though of course
// this does not affect the performance of the resulting data structure).  One
// could also implement faster initializers that handle important special cases
// (e.g., all triangles, or data that is known to be manifold). Since there are
// no strong conditions on the indices of polygons, we assume that the list of
// vertex positions is given in lexicographic order (i.e., that the lowest index
// appearing in any polygon corresponds to the first entry of the list of
// positions and so on).
{
  // define some types, to improve readability
  typedef vector<Index> IndexList;
  typedef IndexList::const_iterator IndexListCIter;
  typedef vector<IndexList> PolygonList;
  typedef PolygonList::const_iterator PolygonListCIter;
  typedef pair<Index, Index> IndexPair;  // ordered pair of vertex indices,
                                         // corresponding to an edge of an
                                         // oriented polygon

  // Clear any existing elements.
  halfedges.clear();
  vertices.clear();
  edges.clear();
  faces.clear();
  boundaries.clear();

  // Since the vertices in our halfedge mesh are stored in a linked list,
  // we will temporarily need to keep track of the correspondence between
  // indices of vertices in our input and pointers to vertices in the new
  // mesh (which otherwise can't be accessed by index).  Note that since
  // we're using a general-purpose map (rather than, say, a vector), we can
  // be a bit more flexible about the indexing scheme: input vertex indices
  // aren't required to be 0-based or 1-based; in fact, the set of indices
  // doesn't even have to be contiguous.  Taking advantage of this fact makes
  // our conversion a bit more robust to different types of input, including
  // data that comes from a subset of a full mesh.

  // maps a vertex index to the corresponding vertex
  map<Index, VertexIter> indexToVertex;

  // Also store the vertex degree, i.e., the number of polygons that use each
  // vertex; this information will be used to check that the mesh is manifold.
  map<VertexIter, Size> vertexDegree;

  // First, we do some basic sanity checks on the input.
  for (const auto & polygon : polygons) {
    if (polygon.size() < 3) {
      // Refuse to build the mesh if any of the polygons have fewer than three
      // vertices.(Note that if we omit this check the code will still
      // construct something fairly meaningful for 1- and 2-point polygons, but
      // enforcing this stricter requirement on the input will help simplify code
      // further downstream, since it can be certain it doesn't have to check for
      // these rather degenerate cases.)
      cerr << "Error converting polygons to halfedge mesh: each polygon must "
              "have at least three vertices."
           << endl;
      exit(1);
    }

    // We want to count the number of distinct vertex indices in this
    // polygon, to make sure it's the same as the number of vertices
    // in the polygon---if they disagree, then the polygon is not valid
    // (or at least, for simplicity we don't handle polygons of this type!).
    set<Index> polygonIndices;

    // loop over polygon vertices
    for (unsigned long i : polygon) {
      polygonIndices.insert(i);

      // allocate one vertex for each new index we encounter
      if (indexToVertex.find(i) == indexToVertex.end()) {
        auto v = newVertex();
        v->halfedge() = halfedges.end();  // this vertex doesn't yet point to any halfedge
        indexToVertex[i] = v;
        vertexDegree[v] = 1;  // we've now seen this vertex only once
      } else {
        // keep track of the number of times we've seen this vertex
        vertexDegree[indexToVertex[i]]++;
      }

    }  // end loop over polygon vertices

    // check that all vertices of the current polygon are distinct
    Size degree = polygon.size();  // number of vertices in this polygon
    if (polygonIndices.size() < degree) {
      cerr << "Error converting polygons to halfedge mesh: one of the input "
              "polygons does not have distinct vertices!"
           << endl;
      cerr << "(vertex indices:";
      for (unsigned long i : polygon) {
        cerr << " " << i;
      }
      cerr << ")" << endl;
      exit(1);
    }  // end check that polygon vertices are distinct

  }  // end basic sanity checks on input

  // The number of faces is just the number of polygons in the input.
  Size nFaces = polygons.size();
  faces.resize(nFaces);  // allocate storage for faces in our new mesh

  // We will store a map from ordered pairs of vertex indices to
  // the corresponding halfedge object in our new (halfedge) mesh;
  // this map gets constructed during the next loop over polygons.
  map<IndexPair, HalfedgeIter> pairToHalfedge;

  // Next, we actually build the halfedge connectivity by again looping over
  // polygons
  PolygonListCIter p;
  FaceIter f;
  for (p = polygons.begin(), f = faces.begin(); p != polygons.end(); p++, f++) {
    vector<HalfedgeIter> faceHalfedges;  // cyclically ordered list of the half
                                         // edges of this face
    Size degree = p->size();             // number of vertices in this polygon

    // loop over the halfedges of this face (equivalently, the ordered pairs of
    // consecutive vertices)
    for (Index i = 0; i < degree; i++) {
      Index a = (*p)[i];                 // current index
      Index b = (*p)[(i + 1) % degree];  // next index, in cyclic order
      IndexPair ab(a, b);
      HalfedgeIter hab;

      // check if this halfedge already exists; if so, we have a problem!
      if (pairToHalfedge.find(ab) != pairToHalfedge.end()) {
        cerr << "Error converting polygons to halfedge mesh: found multiple "
                "oriented edges with indices ("
             << a << ", " << b << ")." << endl;
        cerr << "This means that either (i) more than two faces contain this "
                "edge (hence the surface is nonmanifold), or"
             << endl;
        cerr << "(ii) there are exactly two faces containing this edge, but "
                "they have the same orientation (hence the surface is"
             << endl;
        cerr << "not consistently oriented." << endl;
        exit(1);
      } else  // otherwise, the halfedge hasn't been allocated yet
      {
        // so, we point this vertex pair to a new halfedge
        hab = newHalfedge();
        pairToHalfedge[ab] = hab;

        // link the new halfedge to its face
        hab->face() = f;
        hab->face()->halfedge() = hab;

        // also link it to its starting vertex
        hab->vertex() = indexToVertex[a];
        hab->vertex()->halfedge() = hab;

        // keep a list of halfedges in this face, so that we can later
        // link them together in a loop (via their "next" pointers)
        faceHalfedges.push_back(hab);
      }

      // Also, check if the twin of this halfedge has already been constructed
      // (during construction of a different face).  If so, link the twins
      // together and allocate their shared halfedge.  By the end of this pass
      // over polygons, the only halfedges that will not have a twin will hence
      // be those that sit along the domain boundary.
      IndexPair ba(b, a);
      auto iba = pairToHalfedge.find(ba);
      if (iba != pairToHalfedge.end()) {
        auto hba = iba->second;

        // link the twins
        hab->twin() = hba;
        hba->twin() = hab;

        // allocate and link their edge
        auto e = newEdge();
        hab->edge() = e;
        hba->edge() = e;
        e->halfedge() = hab;
      } else {  // If we didn't find a twin...
        // ...mark this halfedge as being twinless by pointing
        // it to the end of the list of halfedges. If it remains
        // twinless by the end of the current loop over polygons,
        // it will be linked to a boundary face in the next pass.
        hab->twin() = halfedges.end();
      }

    }  // end loop over the current polygon's halfedges

    // Now that all the halfedges of this face have been allocated,
    // we can link them together via their "next" pointers.
    for (Index i = 0; i < degree; i++) {
      Index j = (i + 1) % degree;  // index of the next halfedge, in cyclic order
      faceHalfedges[i]->next() = faceHalfedges[j];
    }

  }  // done building basic halfedge connectivity

  // For each vertex on the boundary, advance its halfedge pointer to one that
  // is also on the boundary.
  for (auto v = verticesBegin(); v != verticesEnd(); v++) {
    // loop over halfedges around vertex
    auto h = v->halfedge();
    do {
      if (h->twin() == halfedges.end()) {
        v->halfedge() = h;
        break;
      }

      h = h->twin()->next();
    } while (h != v->halfedge());  // end loop over halfedges around vertex

  }  // done advancing halfedge pointers for boundary vertices

  // Next we construct new faces for each boundary component.
  for (auto h = halfedgesBegin(); h != halfedgesEnd(); h++)  // loop over all halfedges
  {
    // Any halfedge that does not yet have a twin is on the boundary of the
    // domain. If we follow the boundary around long enough we will of course
    // eventually make a closed loop; we can represent this boundary loop by a
    // new face. To make clear the distinction between faces and boundary loops,
    // the boundary face will (i) have a flag indicating that it is a boundary
    // loop, and (ii) be stored in a list of boundaries, rather than the usual
    // list of faces.  The reason we need the both the flag *and* the separate
    // list is that faces are often accessed in two fundamentally different
    // ways: either by (i) local traversal of the neighborhood of some mesh
    // element using the halfedge structure, or (ii) global traversal of all
    // faces (or boundary loops).
    if (h->twin() == halfedges.end()) {
      auto b = newBoundary();
      vector<HalfedgeIter> boundaryHalfedges;  // keep a list of halfedges along
                                               // the boundary, so we can link
                                               // them together

      // We now need to walk around the boundary, creating new
      // halfedges and edges along the boundary loop as we go.
      auto i = h;
      do {
        // create a twin, which becomes a halfedge of the boundary loop
        auto t = newHalfedge();
        boundaryHalfedges.push_back(t);  // keep a list of all boundary halfedges, in cyclic order
        i->twin() = t;
        t->twin() = i;
        t->face() = b;
        t->vertex() = i->next()->vertex();

        // create the shared edge
        auto e = newEdge();
        e->halfedge() = i;
        i->edge() = e;
        t->edge() = e;

        // Advance i to the next halfedge along the current boundary loop
        // by walking around its target vertex and stopping as soon as we
        // find a halfedge that does not yet have a twin defined.
        i = i->next();
        while (i != h &&  // we're done if we end up back at the beginning of
                          // the loop
               i->twin() != halfedges.end())  // otherwise, we're looking for
                                              // the next twinless halfedge
                                              // along the loop
        {
          i = i->twin();
          i = i->next();
        }
      } while (i != h);

      b->halfedge() = boundaryHalfedges.front();

      // The only pointers that still need to be set are the "next" pointers of
      // the twins; these we can set from the list of boundary halfedges, but we
      // must use the opposite order from the order in the list, since the
      // orientation of the boundary loop is opposite the orientation of the
      // halfedges "inside" the domain boundary.
      Size degree = boundaryHalfedges.size();
      for (Index p = 0; p < degree; p++) {
        Index q = (p - 1 + degree) % degree;
        boundaryHalfedges[p]->next() = boundaryHalfedges[q];
      }

    }  // end construction of one of the boundary loops

    // Note that even though we are looping over all halfedges, we will still
    // construct the appropriate number of boundary loops (and not, say, one
    // loop per boundary halfedge).  The reason is that as we continue to
    // iterate through halfedges, we check whether their twin has been assigned,
    // and since new twins may have been assigned earlier in this loop, we will
    // end up skipping many subsequent halfedges.

  }  // done adding "virtual" faces corresponding to boundary loops

  // To make later traversal of the mesh easier, we will now advance the
  // halfedge
  // associated with each vertex such that it refers to the *first* non-boundary
  // halfedge, rather than the last one.
  for (auto v = verticesBegin(); v != verticesEnd(); v++) {
    v->halfedge() = v->halfedge()->twin()->next();
  }

  // Finally, we check that all vertices are manifold.
  for (auto v = vertices.begin(); v != vertices.end(); v++) {
    // First check that this vertex is not a "floating" vertex;
    // if it is then we do not have a valid 2-manifold surface.
    if (v->halfedge() == halfedges.end()) {
      cerr << "Error converting polygons to halfedge mesh: some vertices are "
              "not referenced by any polygon."
           << endl;
      exit(1);
    }

    // Next, check that the number of halfedges emanating from this vertex in
    // our half edge data structure equals the number of polygons containing
    // this vertex, which we counted during our first pass over the mesh.  If
    // not, then our vertex is not a "fan" of polygons, but instead has some
    // other (nonmanifold) structure.
    Size count = 0;
    auto h = v->halfedge();
    do {
      if (!h->face()->isBoundary()) {
        count++;
      }
      h = h->twin()->next();
    } while (h != v->halfedge());

    if (count != vertexDegree[v]) {
      cerr << "Error converting polygons to halfedge mesh: at least one of the "
              "vertices is nonmanifold."
           << endl;
      exit(1);
    }
  }  // end loop over vertices

  // Now that we have the connectivity, we copy the list of vertex
  // positions into member variables of the individual vertices.
  if (vertexPositions.size() < vertices.size()) {
    cerr << "Error converting polygons to halfedge mesh: number of vertex "
            "positions is different from the number of distinct vertices!"
         << endl;
    cerr << "(number of positions in input: " << vertexPositions.size() << ")"
         << endl;
    cerr << "(  number of vertices in mesh: " << vertices.size() << ")" << endl;
    exit(1);
  }
  // Since an STL map internally sorts its keys, we can iterate over the map
  // from vertex indices to vertex iterators to visit our (input) vertices in
  // lexicographic order
  int i = 0;
  for (map<Index, VertexIter>::const_iterator e = indexToVertex.begin();
       e != indexToVertex.end(); e++) {
    // grab a pointer to the vertex associated with the current key (i.e., the
    // current index)
    VertexIter v = e->second;

    // set the att of this vertex to the corresponding
    // position in the input
    v->position = vertexPositions[i];
    i++;
  }

}